

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_test.cpp
# Opt level: O2

void __thiscall Parallel_Basics_Test::~Parallel_Basics_Test(Parallel_Basics_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parallel, Basics) {
    std::atomic<int> counter{0};
    ParallelFor(0, 1000, [&](int64_t) { ++counter; });
    EXPECT_EQ(1000, counter);

    counter = 0;
    ParallelFor(10, 1010, [&](int64_t start, int64_t end) {
        EXPECT_GT(end, start);
        EXPECT_TRUE(start >= 10 && start < 1010);
        EXPECT_TRUE(end > 10 && end <= 1010);
        for (int64_t i = start; i < end; ++i)
            ++counter;
    });
    EXPECT_EQ(1000, counter);

    counter = 0;
    ParallelFor2D(Bounds2i{{0, 0}, {15, 14}}, [&](Point2i p) { ++counter; });
    EXPECT_EQ(15 * 14, counter);
}